

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall pybind11::buffer_info::~buffer_info(buffer_info *this)

{
  void *pvVar1;
  
  if ((*(long *)(this + 0x70) != 0) && (this[0x78] == (buffer_info)0x1)) {
    PyBuffer_Release();
    if (*(void **)(this + 0x70) != (void *)0x0) {
      operator_delete(*(void **)(this + 0x70),0x50);
    }
  }
  pvVar1 = *(void **)(this + 0x58);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)(this + 0x68) - (long)pvVar1);
  }
  pvVar1 = *(void **)(this + 0x40);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)(this + 0x50) - (long)pvVar1);
  }
  if (*(buffer_info **)(this + 0x18) != this + 0x28) {
    operator_delete(*(buffer_info **)(this + 0x18),*(long *)(this + 0x28) + 1);
    return;
  }
  return;
}

Assistant:

~buffer_info() {
        if (view && ownview) { PyBuffer_Release(view); delete view; }
    }